

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffphpr(fitsfile *fptr,int simple,int bitpix,int naxis,long *naxes,LONGLONG pcount,
          LONGLONG gcount,int extend,int *status)

{
  int in_ECX;
  long in_R8;
  int *in_stack_00000018;
  LONGLONG naxesll [20];
  int ii;
  LONGLONG in_stack_00000118;
  LONGLONG *in_stack_00000120;
  int in_stack_0000012c;
  int in_stack_00000130;
  int in_stack_00000134;
  fitsfile *in_stack_00000138;
  LONGLONG in_stack_00000150;
  int in_stack_00000158;
  int *in_stack_00000160;
  undefined8 local_d8 [21];
  int local_2c;
  long local_20;
  int local_14;
  
  local_20 = in_R8;
  local_14 = in_ECX;
  for (local_2c = 0; local_2c < local_14 && local_2c < 0x14; local_2c = local_2c + 1) {
    local_d8[local_2c] = *(undefined8 *)(local_20 + (long)local_2c * 8);
  }
  ffphprll(in_stack_00000138,in_stack_00000134,in_stack_00000130,in_stack_0000012c,in_stack_00000120
           ,in_stack_00000118,in_stack_00000150,in_stack_00000158,in_stack_00000160);
  return *in_stack_00000018;
}

Assistant:

int ffphpr( fitsfile *fptr, /* I - FITS file pointer                        */
            int simple,     /* I - does file conform to FITS standard? 1/0  */
            int bitpix,     /* I - number of bits per data value pixel      */
            int naxis,      /* I - number of axes in the data array         */
            long naxes[],   /* I - length of each data axis                 */
            LONGLONG pcount, /* I - number of group parameters (usually 0)   */
            LONGLONG gcount, /* I - number of random groups (usually 1 or 0) */
            int extend,     /* I - may FITS file have extensions?           */
            int *status)    /* IO - error status                            */
/*
  write required primary header keywords
*/
{
    int ii;
    LONGLONG naxesll[20];
   
    for (ii = 0; (ii < naxis) && (ii < 20); ii++)
       naxesll[ii] = naxes[ii];

    ffphprll(fptr, simple, bitpix, naxis, naxesll, pcount, gcount,
             extend, status);

    return(*status);
}